

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gba.h
# Opt level: O3

void ClownLZSS::Internal::Gba::EncodeMatches<std::ofstream>
               (uchar *data,Matches *matches,size_t total_matches,
               CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_> *output)

{
  ClownLZSS_Match *pCVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  DescriptorFieldWriter<decltype(output)> descriptor_bits;
  DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
  DStack_58;
  
  BitField::
  DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
  ::DescriptorFieldWriter(&DStack_58,output);
  if (total_matches != 0) {
    pCVar1 = (matches->_M_t).
             super___uniq_ptr_impl<ClownLZSS_Match,_ClownLZSS::Internal::MatchDeleter>._M_t.
             super__Tuple_impl<0UL,_ClownLZSS_Match_*,_ClownLZSS::Internal::MatchDeleter>.
             super__Head_base<0UL,_ClownLZSS_Match_*,_false>._M_head_impl;
    lVar3 = 0;
    do {
      uVar2 = *(ulong *)((long)&pCVar1->source + lVar3);
      lVar4 = *(long *)((long)&pCVar1->destination + lVar3);
      if (uVar2 == lVar4 + 1U) {
        if (DStack_58.
            super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
            .bits_remaining == 0) {
          BitField::
          DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
          ::WriteBitsImplementation(&DStack_58);
        }
        DStack_58.
        super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
        .bits = DStack_58.
                super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
                .bits << 1;
        DStack_58.
        super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
        .bits_remaining =
             DStack_58.
             super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
             .bits_remaining - 1;
      }
      else {
        if (DStack_58.
            super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
            .bits_remaining == 0) {
          BitField::
          DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
          ::WriteBitsImplementation(&DStack_58);
          uVar2 = *(ulong *)((long)&pCVar1->source + lVar3);
          lVar4 = *(long *)((long)&pCVar1->destination + lVar3);
        }
        DStack_58.
        super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
        .bits = DStack_58.
                super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
                .bits * 2 + 1;
        DStack_58.
        super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
        .bits_remaining =
             DStack_58.
             super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
             .bits_remaining - 1;
        if (0xf < *(long *)((long)&pCVar1->length + lVar3) - 3U) {
          __assert_fail("IsInRange(length, 0u, maximum_encoded_length)",
                        "/workspace/llm4binary/github/license_c_cmakelists/Clownacy[P]clownlzss/compressors/gba.h"
                        ,0x79,
                        "unsigned int ClownLZSS::Internal::Gba::EncodeMatch(const ClownLZSS_Match &)"
                       );
        }
        if (0xfff < lVar4 + ~uVar2) {
          __assert_fail("IsInRange(offset, 0u, maximum_encoded_offset)",
                        "/workspace/llm4binary/github/license_c_cmakelists/Clownacy[P]clownlzss/compressors/gba.h"
                        ,0x7a,
                        "unsigned int ClownLZSS::Internal::Gba::EncodeMatch(const ClownLZSS_Match &)"
                       );
        }
        std::ostream::put((char)(output->
                                super_OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                                ).output);
      }
      std::ostream::put((char)(output->
                              super_OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                              ).output);
      lVar3 = lVar3 + 0x18;
    } while (total_matches * 0x18 != lVar3);
  }
  BitField::
  DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
  ::~DescriptorFieldWriter(&DStack_58);
  return;
}

Assistant:

void EncodeMatches(const unsigned char* const data, const Matches& matches, std::size_t total_matches, CompressorOutput<T> &output)
			{
				DescriptorFieldWriter<decltype(output)> descriptor_bits(output);
				for (const auto& match : std::ranges::subrange(&matches[0], &matches[total_matches]))
				{
					if (CLOWNLZSS_MATCH_IS_LITERAL(&match))
					{
						descriptor_bits.Push(0);
						output.Write(data[match.destination]);
					}
					else
					{
						descriptor_bits.Push(1);
						output.WriteLE16(EncodeMatch(match));
					}
				}
			}